

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O1

bool __thiscall ON_Quaternion::GetRotation(ON_Quaternion *this,ON_Xform *xform)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  long lVar4;
  ON_Xform *pOVar5;
  byte bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ON_Quaternion q;
  ON_Quaternion local_48;
  double local_28;
  double local_20;
  
  bVar6 = 0;
  local_48.a = this->a;
  local_48.b = this->b;
  local_48.c = this->c;
  local_48.d = this->d;
  bVar2 = Unitize(&local_48);
  if (!bVar2) {
    if (((((this->a != 0.0) || (NAN(this->a))) ||
         ((this->b != 0.0 || ((NAN(this->b) || (this->c != 0.0)))))) || (NAN(this->c))) ||
       ((this->d != 0.0 || (NAN(this->d))))) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_quaternion.cpp"
                 ,0x125,"","ON_Quaternion::GetRotation(ON_Xform) quaternion is invalid");
      pOVar5 = &ON_Xform::IdentityTransformation;
    }
    else {
      pOVar5 = &ON_Xform::Zero4x4;
    }
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      xform->m_xform[0][0] = pOVar5->m_xform[0][0];
      pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      xform = (ON_Xform *)((long)xform + ((ulong)bVar6 * -2 + 1) * 8);
    }
    return bVar2;
  }
  if ((((ABS(local_48.a - this->a) <= 2.3283064365386963e-10) &&
       (ABS(local_48.b - this->b) <= 2.3283064365386963e-10)) &&
      (ABS(local_48.c - this->c) <= 2.3283064365386963e-10)) &&
     (ABS(local_48.d - this->d) <= 2.3283064365386963e-10)) {
    local_48.a = this->a;
    local_48.b = this->b;
    local_48.c = this->c;
    local_48.d = this->d;
  }
  dVar1 = local_48.d;
  dVar9 = local_48.c;
  dVar8 = local_48.b;
  dVar7 = local_48.a;
  dVar12 = local_48.a * local_48.d;
  dVar10 = local_48.b * local_48.c;
  dVar11 = dVar10 + dVar12;
  pdVar3 = ON_Xform::operator[](xform,1);
  *pdVar3 = dVar11 + dVar11;
  local_20 = dVar8 * dVar1;
  dVar11 = dVar9 * dVar7;
  local_28 = local_20 - dVar11;
  local_28 = local_28 + local_28;
  pdVar3 = ON_Xform::operator[](xform,2);
  *pdVar3 = local_28;
  pdVar3 = ON_Xform::operator[](xform,3);
  *pdVar3 = 0.0;
  dVar10 = dVar10 - dVar12;
  pdVar3 = ON_Xform::operator[](xform,0);
  pdVar3[1] = dVar10 + dVar10;
  dVar7 = dVar7 * dVar8;
  dVar10 = dVar9 * dVar1 + dVar7;
  pdVar3 = ON_Xform::operator[](xform,2);
  pdVar3[1] = dVar10 + dVar10;
  pdVar3 = ON_Xform::operator[](xform,3);
  pdVar3[1] = 0.0;
  dVar11 = dVar11 + local_20;
  pdVar3 = ON_Xform::operator[](xform,0);
  pdVar3[2] = dVar11 + dVar11;
  dVar7 = dVar9 * dVar1 - dVar7;
  pdVar3 = ON_Xform::operator[](xform,1);
  pdVar3[2] = dVar7 + dVar7;
  pdVar3 = ON_Xform::operator[](xform,3);
  pdVar3[2] = 0.0;
  dVar8 = dVar8 * dVar8;
  dVar9 = dVar9 * dVar9;
  dVar1 = dVar1 * dVar1;
  local_48.b = dVar8;
  local_48.c = dVar9;
  local_48.d = dVar1;
  pdVar3 = ON_Xform::operator[](xform,0);
  *pdVar3 = 1.0 - (dVar9 + dVar1 + dVar9 + dVar1);
  pdVar3 = ON_Xform::operator[](xform,1);
  pdVar3[1] = 1.0 - (dVar1 + dVar8 + dVar1 + dVar8);
  pdVar3 = ON_Xform::operator[](xform,2);
  pdVar3[2] = 1.0 - (dVar9 + dVar8 + dVar9 + dVar8);
  pdVar3 = ON_Xform::operator[](xform,2);
  pdVar3[3] = 0.0;
  pdVar3 = ON_Xform::operator[](xform,1);
  pdVar3[3] = 0.0;
  pdVar3 = ON_Xform::operator[](xform,0);
  pdVar3[3] = 0.0;
  pdVar3 = ON_Xform::operator[](xform,3);
  pdVar3[3] = 1.0;
  return bVar2;
}

Assistant:

bool ON_Quaternion::GetRotation(ON_Xform& xform) const
{
  bool rc;
  ON_Quaternion q(*this);
  if ( q.Unitize() )
  {
    if (    fabs(q.a-a) <= ON_ZERO_TOLERANCE
         && fabs(q.b-b) <= ON_ZERO_TOLERANCE
         && fabs(q.c-c) <= ON_ZERO_TOLERANCE
         && fabs(q.d-d) <= ON_ZERO_TOLERANCE
         )
    {
      // "this" was already unitized - don't tweak bits
      q = *this;
    }
    xform[1][0] = 2.0*(q.b*q.c + q.a*q.d);
    xform[2][0] = 2.0*(q.b*q.d - q.a*q.c);
    xform[3][0] = 0.0;

    xform[0][1] = 2.0*(q.b*q.c - q.a*q.d);
    xform[2][1] = 2.0*(q.c*q.d + q.a*q.b);
    xform[3][1] = 0.0;

    xform[0][2] = 2.0*(q.b*q.d + q.a*q.c);
    xform[1][2] = 2.0*(q.c*q.d - q.a*q.b);
    xform[3][2] = 0.0;

    q.b = q.b*q.b;
    q.c = q.c*q.c;
    q.d = q.d*q.d;
    xform[0][0] = 1.0 - 2.0*(q.c + q.d);
    xform[1][1] = 1.0 - 2.0*(q.b + q.d);
    xform[2][2] = 1.0 - 2.0*(q.b + q.c);

    xform[0][3] = xform[1][3] = xform[2][3] = 0.0;
    xform[3][3] = 1.0;
    rc = true;
  }
  else if ( IsZero() )
  {
    xform = ON_Xform::Zero4x4;
    rc = false;
  }
  else
  {
    // something is seriously wrong
    ON_ERROR("ON_Quaternion::GetRotation(ON_Xform) quaternion is invalid");
    xform = ON_Xform::IdentityTransformation;
    rc = false;
  }

  return rc;
}